

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O0

bool __thiscall QUuid::isNull(QUuid *this)

{
  bool local_21;
  size_t i;
  QUuid *this_local;
  
  i = 0;
  while( true ) {
    if (7 < i) {
      local_21 = false;
      if ((this->data1 == 0) && (local_21 = false, this->data2 == 0)) {
        local_21 = this->data3 == 0;
      }
      return local_21;
    }
    if (this->data4[i] != '\0') break;
    i = i + 1;
  }
  return false;
}

Assistant:

constexpr bool isNull(QT6_DECL_NEW_OVERLOAD) const noexcept
    {
#if defined(__cpp_lib_bit_cast) && defined(QT_SUPPORTS_INT128)
        return std::bit_cast<quint128>(*this) == 0;
#else
        // QNX fails to compile
        // data4[0] == 0 && data4[1] == 0 && ...
        // in constexpr context, so rewrite it using a loop. This way we have
        // only single data4[i] != 0 check at each iteration
        for (size_t i = 0; i < 8; ++i) {
            if (data4[i] != 0)
                return false;
        }
        return data1 == 0 && data2 == 0 && data3 == 0;
#endif
    }